

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O2

void __thiscall
nonstd::vptr::detail::
compressed_ptr<(anonymous_namespace)::InitList,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::InitList>,_std::default_delete<(anonymous_namespace)::InitList>_>
::reset(compressed_ptr<(anonymous_namespace)::InitList,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::InitList>,_std::default_delete<(anonymous_namespace)::InitList>_>
        *this,element_type *v)

{
  pointer piVar1;
  pointer pIVar2;
  element_type *__ptr;
  
  __ptr = v;
  pIVar2 = (pointer)operator_new(0x28);
  piVar1 = (v->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  (pIVar2->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (v->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  (pIVar2->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar1;
  (pIVar2->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (v->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (v->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (v->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (v->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  pIVar2->c = v->c;
  (pIVar2->s).state = move_constructed;
  (pIVar2->s).value = (v->s).value;
  (v->s).state = moved_from;
  std::default_delete<(anonymous_namespace)::InitList>::operator()
            ((default_delete<(anonymous_namespace)::InitList> *)this->ptr,__ptr);
  this->ptr = pIVar2;
  return;
}

Assistant:

void reset( element_type && v )
    {
        reset( get_cloner()( std::move( v ) ) );
    }